

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema.hpp
# Opt level: O2

string * __thiscall
nlohmann::json_uri::fragment_abi_cxx11_(string *__return_storage_ptr__,json_uri *this)

{
  bool bVar1;
  
  bVar1 = std::operator==(&this->identifier_,"");
  if (bVar1) {
    json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    to_string(__return_storage_ptr__,&this->pointer_);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->identifier_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fragment() const
	{
		if (identifier_ == "")
			return pointer_.to_string();
		else
			return identifier_;
	}